

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuttonChenAdapter.cpp
# Opt level: O1

void __thiscall
OpenMD::SuttonChenAdapter::makeSuttonChen
          (SuttonChenAdapter *this,RealType c,RealType m,RealType n,RealType alpha,RealType epsilon)

{
  AtomType *this_00;
  bool bVar1;
  SCAtypeParameters scParam;
  undefined1 local_89;
  SimpleTypeData<OpenMD::SCAtypeParameters> *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [2];
  RealType local_70;
  RealType local_68;
  RealType local_60;
  RealType local_58;
  RealType local_50;
  shared_ptr<OpenMD::GenericData> local_48;
  SCAtypeParameters local_38;
  
  local_70 = c;
  local_68 = m;
  local_60 = n;
  local_58 = alpha;
  local_50 = epsilon;
  bVar1 = AtomType::hasProperty(this->at_,(string *)OpenMD::SCtypeID_abi_cxx11_);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)OpenMD::SCtypeID_abi_cxx11_);
  }
  local_38.c = local_70;
  local_38.m = local_68;
  local_38.n = local_60;
  local_38.alpha = local_58;
  local_38.epsilon = local_50;
  this_00 = this->at_;
  local_88 = (SimpleTypeData<OpenMD::SCAtypeParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>>,std::__cxx11::string_const&,OpenMD::SCAtypeParameters&>
            (a_Stack_80,&local_88,
             (allocator<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>_> *)&local_89,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenMD::SCtypeID_abi_cxx11_,&local_38);
  local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_88->super_GenericData;
  local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_80[0]._M_pi;
  local_88 = (SimpleTypeData<OpenMD::SCAtypeParameters> *)0x0;
  a_Stack_80[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(this_00,&local_48);
  if (local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (a_Stack_80[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_80[0]._M_pi);
  }
  return;
}

Assistant:

void SuttonChenAdapter::makeSuttonChen(RealType c, RealType m, RealType n,
                                         RealType alpha, RealType epsilon) {
    if (isSuttonChen()) { at_->removeProperty(SCtypeID); }

    SCAtypeParameters scParam {};
    scParam.c       = c;
    scParam.m       = m;
    scParam.n       = n;
    scParam.alpha   = alpha;
    scParam.epsilon = epsilon;

    at_->addProperty(std::make_shared<SCAtypeData>(SCtypeID, scParam));
  }